

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Oscilloscope.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Oscilloscope::ChFunction_Oscilloscope
          (ChFunction_Oscilloscope *this,ChFunction_Oscilloscope *other)

{
  list<double,_std::allocator<double>_> *plVar1;
  double dVar2;
  int iVar3;
  
  plVar1 = &this->values;
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Oscilloscope_00b452b0;
  (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size = 0;
  if (this != other) {
    std::__cxx11::list<double,std::allocator<double>>::
    _M_assign_dispatch<std::_List_const_iterator<double>>
              ((list<double,std::allocator<double>> *)plVar1,
               (other->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node.
               super__List_node_base._M_next,&other->values);
  }
  dVar2 = other->dx;
  this->end_x = other->end_x;
  this->dx = dVar2;
  iVar3 = other->amount;
  this->max_amount = other->max_amount;
  this->amount = iVar3;
  return;
}

Assistant:

ChFunction_Oscilloscope::ChFunction_Oscilloscope(const ChFunction_Oscilloscope& other) {
    values = other.values;
    dx = other.dx;
    end_x = other.end_x;
    amount = other.amount;
    max_amount = other.max_amount;
}